

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

bool slang::syntax::SyntaxFacts::isPossibleAnsiPort(TokenKind kind)

{
  uint uVar1;
  bool bVar2;
  undefined6 in_register_0000003a;
  
  uVar1 = (uint)CONCAT62(in_register_0000003a,kind);
  if ((((0x3f < uVar1 - 0xc2) || ((0x8000004000000083U >> ((ulong)(uVar1 - 0xc2) & 0x3f) & 1) == 0))
      && ((0x1c < uVar1 || ((0x14040004U >> (uVar1 & 0x1f) & 1) == 0)))) && (uVar1 != 0x144)) {
    bVar2 = isNetType(kind);
    if (!bVar2) {
      bVar2 = isPossibleDataType(kind);
      return bVar2;
    }
  }
  return true;
}

Assistant:

bool SyntaxFacts::isPossibleAnsiPort(TokenKind kind) {
    switch (kind) {
        case TokenKind::InterfaceKeyword:
        case TokenKind::Identifier:
        case TokenKind::Dot:
        case TokenKind::Comma:
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
        case TokenKind::RefKeyword:
        case TokenKind::VarKeyword:
        case TokenKind::OpenParenthesisStar:
            return true;
        default:
            return isNetType(kind) || isPossibleDataType(kind);
    }
}